

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall rsg::BlockStatement::BlockStatement(BlockStatement *this,GeneratorState *state)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__BlockStatement_00c454e0;
  VariableScope::VariableScope(&this->m_scope);
  (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  init(this,(EVP_PKEY_CTX *)state);
  return;
}

Assistant:

BlockStatement::BlockStatement (GeneratorState& state)
{
	init(state);
}